

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O2

void __thiscall sock1::operator()(sock1 *this,error_code *e)

{
  ostream *poVar1;
  ssize_t sVar2;
  int iVar3;
  char c;
  
  if (e->_M_value != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar1 = std::operator<<(poVar1,"!e");
    poVar1 = std::operator<<(poVar1," at ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x21);
    std::endl<char,std::char_traits<char>>(poVar1);
    return_code = 1;
  }
  c = -1;
  sVar2 = recv(this->fd,&c,1,0);
  iVar3 = this->counter;
  if (iVar3 == 10) {
    if ((int)sVar2 != 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar1 = std::operator<<(poVar1,"n==0");
      poVar1 = std::operator<<(poVar1," at ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x25);
      std::endl<char,std::char_traits<char>>(poVar1);
      return_code = 1;
    }
    booster::aio::io_service::stop();
    done = true;
  }
  else {
    if (iVar3 != c) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Fail: ");
      poVar1 = std::operator<<(poVar1,"c==counter");
      poVar1 = std::operator<<(poVar1," at ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2a);
      std::endl<char,std::char_traits<char>>(poVar1);
      return_code = 1;
      iVar3 = this->counter;
    }
    this->counter = iVar3 + 1;
    async_run(this);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(!e);
		char c=-1;
		int n = ::recv(fd,&c,1,0);
		if(counter == 10) {
			TEST(n==0);
			srv->stop();
			done=true;
		}
		else  {
			TEST(c==counter);
			counter++;
			async_run();
		}

	}